

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O2

void __thiscall
commodities_customCxNumber_Test::~commodities_customCxNumber_Test
          (commodities_customCxNumber_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commodities, customCxNumber)
{
    disableCustomCommodities();
    unsigned int comm = 56474732;
    auto ss = getCommodityName(comm);
    EXPECT_EQ(ss, "CXCOMM[56474732]");
    auto c = getCommodity(ss);
    EXPECT_EQ(c, comm);

    enableCustomCommodities();
}